

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall pbrt::UberMaterial::UberMaterial(UberMaterial *this,string *name)

{
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffffc8;
  Material *in_stack_ffffffffffffffd0;
  
  Material::Material(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *in_RDI = &PTR_toString_abi_cxx11__0029c108;
  math::vec3f::vec3f((vec3f *)(in_RDI + 7),0.25);
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x20857b);
  math::vec3f::vec3f((vec3f *)(in_RDI + 0xb),0.25);
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x2085a6);
  math::vec3f::vec3f((vec3f *)(in_RDI + 0xf),0.0);
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x2085cf);
  math::vec3f::vec3f((vec3f *)(in_RDI + 0x13),0.0);
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x2085fa);
  math::vec3f::vec3f((vec3f *)(in_RDI + 0x17),1.0);
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x208626);
  *(undefined4 *)(in_RDI + 0x1b) = 0;
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x208642);
  *(undefined4 *)(in_RDI + 0x1e) = 0;
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x20865e);
  *(undefined4 *)(in_RDI + 0x21) = 0x3fc00000;
  *(undefined4 *)((long)in_RDI + 0x10c) = 0x3dcccccd;
  *(undefined4 *)(in_RDI + 0x22) = 0;
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x20869a);
  *(undefined4 *)(in_RDI + 0x25) = 0;
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x2086b6);
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x2086c7);
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x2086d8);
  return;
}

Assistant:

UberMaterial(const std::string &name = "") : Material(name) {}